

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::Texture3DFilteringCase
          (Texture3DFilteringCase *this,Context *context,char *name,char *desc,deUint32 minFilter,
          deUint32 magFilter,deUint32 wrapS,deUint32 wrapT,deUint32 wrapR,deUint32 internalFormat,
          int width,int height,int depth)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture3DFilteringCase_02132098;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_wrapR = wrapR;
  this->m_internalFormat = internalFormat;
  this->m_width = width;
  this->m_height = height;
  this->m_depth = depth;
  this->m_gradientTex = (Texture3D *)0x0;
  this->m_gridTex = (Texture3D *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context->m_renderCtx,context->m_testCtx->m_log,GLSL_VERSION_300_ES,
             PRECISION_HIGHP);
  *(undefined8 *)
   ((long)&(this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_cases).
  super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cases).
  super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Texture3DFilteringCase::Texture3DFilteringCase (Context& context, const char* name, const char* desc, deUint32 minFilter, deUint32 magFilter, deUint32 wrapS, deUint32 wrapT, deUint32 wrapR, deUint32 internalFormat, int width, int height, int depth)
	: TestCase			(context, name, desc)
	, m_minFilter		(minFilter)
	, m_magFilter		(magFilter)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_wrapR			(wrapR)
	, m_internalFormat	(internalFormat)
	, m_width			(width)
	, m_height			(height)
	, m_depth			(depth)
	, m_gradientTex		(DE_NULL)
	, m_gridTex			(DE_NULL)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_caseNdx			(0)
{
}